

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

bool lsim::deserialize_library(LSimContext *context,ModelCircuitLibrary *lib,char *filename)

{
  string *psVar1;
  mapped_type mVar2;
  uint uVar3;
  __node_base_ptr p_Var4;
  char *pcVar5;
  undefined1 uVar6;
  LSimContext *this;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  int iVar12;
  xml_node *pxVar13;
  char_t *pcVar14;
  char_t *filename_00;
  const_iterator cVar15;
  ModelComponent *this_00;
  Property *pPVar16;
  mapped_type *pmVar17;
  ModelWire *this_01;
  long lVar18;
  ulong uVar19;
  __node_base_ptr p_Var20;
  ModelCircuit *this_02;
  ulong uVar21;
  byte bVar22;
  size_t idx;
  __node_base_ptr p_Var23;
  _Hash_node_base *p_Var24;
  float fVar25;
  float y;
  xml_node pos_node;
  xml_node orient_node;
  xml_node comp_node;
  xml_attribute prop_tristate;
  xml_node initial_output_node;
  xml_node desc_node;
  xml_attribute controls_attr;
  xml_node circuit_node;
  xml_node lsim_node;
  xml_node main_node;
  xml_node ref_node;
  xml_named_node_iterator __begin2;
  xml_attribute type_attr;
  xml_attribute attr_name;
  xml_attribute outputs_attr;
  xml_attribute attr_file;
  xml_named_node_iterator __begin2_1;
  xml_named_node_iterator __end2;
  xml_named_node_iterator __end2_1;
  Deserializer deserializer;
  xml_attribute local_328;
  xml_attribute local_320;
  xml_node local_318;
  xml_attribute local_310;
  undefined1 local_301;
  ModelCircuit *local_300;
  float local_2f4;
  xml_attribute local_2f0;
  Point local_2e8;
  ModelCircuitLibrary *local_2e0;
  Point local_2d8;
  xml_attribute local_2d0;
  xml_node local_2c8;
  xml_node local_2c0;
  xml_object_range<pugi::xml_named_node_iterator> local_2b8;
  undefined1 local_288 [32];
  undefined1 local_268 [16];
  undefined1 local_258 [40];
  xml_node_struct *pxStack_230;
  xml_node_struct *local_228;
  xml_named_node_iterator local_218;
  xml_named_node_iterator local_1f8;
  xml_named_node_iterator local_1d8;
  xml_named_node_iterator local_1b8;
  xml_object_range<pugi::xml_named_node_iterator> local_198;
  xml_named_node_iterator local_168;
  xml_document local_148;
  LSimContext *local_78;
  ModelCircuitLibrary *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (context == (LSimContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x23e,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  local_2e0 = lib;
  if (lib == (ModelCircuitLibrary *)0x0) {
    __assert_fail("lib",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x23f,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x240,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  pugi::xml_document::xml_document(&local_148);
  local_70 = (ModelCircuitLibrary *)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_78 = context;
  pugi::xml_document::load_file
            ((xml_parse_result *)&local_2b8,&local_148,filename,0x74,encoding_auto);
  local_301 = pugi::xml_parse_result::operator_cast_to_bool((xml_parse_result *)&local_2b8);
  if ((bool)local_301) {
    local_70 = local_2e0;
    local_2c0 = pugi::xml_node::child(&local_148.super_xml_node,"lsim");
    bVar7 = pugi::xml_node::operator!(&local_2c0);
    if (!bVar7) {
      pugi::xml_node::children(&local_2b8,&local_2c0,"reference");
      local_258._0_8_ = local_2b8._begin._name;
      local_268._0_8_ = local_2b8._begin._wrap._root;
      local_268._8_8_ = local_2b8._begin._parent._root;
      local_198._begin._name = local_2b8._end._name;
      local_198._begin._wrap._root = local_2b8._end._wrap._root;
      local_198._begin._parent._root = local_2b8._end._parent._root;
      bVar7 = pugi::xml_named_node_iterator::operator!=
                        ((xml_named_node_iterator *)local_268,&local_198._begin);
      if (bVar7) {
        do {
          pxVar13 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)local_268);
          local_288._0_8_ = pxVar13->_root;
          local_218._wrap._root =
               (xml_node_struct *)pugi::xml_node::attribute((xml_node *)local_288,"name");
          bVar8 = pugi::xml_attribute::operator!((xml_attribute *)&local_218);
          if (bVar8) {
LAB_0011206c:
            if (bVar7 != false) goto LAB_0011356f;
            break;
          }
          local_1d8._wrap._root =
               (xml_node_struct *)pugi::xml_node::attribute((xml_node *)local_288,"file");
          bVar8 = pugi::xml_attribute::operator!((xml_attribute *)&local_1d8);
          this = local_78;
          if (bVar8) goto LAB_0011206c;
          pcVar14 = pugi::xml_attribute::value((xml_attribute *)&local_218);
          filename_00 = pugi::xml_attribute::value((xml_attribute *)&local_1d8);
          LSimContext::load_reference_library(this,pcVar14,filename_00);
          pcVar14 = pugi::xml_attribute::value((xml_attribute *)&local_218);
          ModelCircuitLibrary::add_reference(local_2e0,pcVar14);
          pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)local_268);
          bVar7 = pugi::xml_named_node_iterator::operator!=
                            ((xml_named_node_iterator *)local_268,&local_198._begin);
        } while (bVar7);
      }
      pugi::xml_node::children(&local_198,&local_2c0,"circuit");
      local_1b8._name = local_198._begin._name;
      local_1b8._wrap._root = local_198._begin._wrap._root;
      local_1b8._parent._root = local_198._begin._parent._root;
      local_168._name = local_198._end._name;
      local_168._wrap._root = local_198._end._wrap._root;
      local_168._parent._root = local_198._end._parent._root;
      bVar7 = pugi::xml_named_node_iterator::operator!=(&local_1b8,&local_168);
      if (bVar7) {
        do {
          pxVar13 = pugi::xml_named_node_iterator::operator*(&local_1b8);
          local_2c8._root = pxVar13->_root;
          local_2b8._begin._wrap._root =
               (xml_node_struct *)pugi::xml_node::attribute(&local_2c8,"name");
          pcVar14 = pugi::xml_attribute::as_string((xml_attribute *)&local_2b8,"");
          if ((pcVar14 != (char_t *)0x0) &&
             (local_300 = ModelCircuitLibrary::create_circuit(local_70,pcVar14,local_78),
             local_300 != (ModelCircuit *)0x0)) {
            pugi::xml_node::children(&local_2b8,&local_2c8,"component");
            local_288._16_8_ = local_2b8._begin._name;
            local_288._0_8_ = local_2b8._begin._wrap._root;
            local_288._8_8_ = local_2b8._begin._parent._root;
            local_218._name = local_2b8._end._name;
            local_218._wrap._root = local_2b8._end._wrap._root;
            local_218._parent._root = local_2b8._end._parent._root;
            bVar7 = pugi::xml_named_node_iterator::operator!=
                              ((xml_named_node_iterator *)local_288,&local_218);
            while (bVar7 != false) {
              pxVar13 = pugi::xml_named_node_iterator::operator*
                                  ((xml_named_node_iterator *)local_288);
              local_318._root = pxVar13->_root;
              local_1d8._wrap._root = (xml_node_struct *)pugi::xml_node::attribute(&local_318,"id");
              bVar7 = pugi::xml_attribute::operator!((xml_attribute *)&local_1d8);
              if (bVar7) goto switchD_0011238e_caseD_5;
              local_258._32_8_ = pugi::xml_node::attribute(&local_318,"type");
              bVar7 = pugi::xml_attribute::operator!((xml_attribute *)(local_258 + 0x20));
              if (bVar7) goto switchD_0011238e_caseD_5;
              pcVar14 = pugi::xml_attribute::as_string((xml_attribute *)(local_258 + 0x20),"");
              std::__cxx11::string::string((string *)local_268,pcVar14,(allocator *)&local_1f8);
              cVar15 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)(anonymous_namespace)::name_to_component_type_abi_cxx11_,
                              (key_type *)local_268);
              if ((xml_node_struct *)local_268._0_8_ != (xml_node_struct *)local_258) {
                operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
              }
              if (cVar15.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                  ._M_cur == (__node_type *)0x0) goto switchD_0011238e_caseD_5;
              iVar12 = *(int *)((long)cVar15.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                      ._M_cur + 0x28);
              local_268._0_8_ = pugi::xml_node::attribute(&local_318,"inputs");
              bVar7 = pugi::xml_attribute::operator!((xml_attribute *)local_268);
              if (bVar7) goto switchD_0011238e_caseD_5;
              local_1f8._wrap._root =
                   (xml_node_struct *)pugi::xml_node::attribute(&local_318,"outputs");
              bVar7 = pugi::xml_attribute::operator!((xml_attribute *)&local_1f8);
              if (bVar7) goto switchD_0011238e_caseD_5;
              local_2d0 = pugi::xml_node::attribute(&local_318,"controls");
              bVar7 = pugi::xml_attribute::operator!(&local_2d0);
              if (bVar7) goto switchD_0011238e_caseD_5;
              uVar9 = pugi::xml_attribute::as_int((xml_attribute *)local_268,0);
              uVar10 = pugi::xml_attribute::as_int((xml_attribute *)&local_1f8,0);
              iVar11 = pugi::xml_attribute::as_int(&local_2d0,0);
              if (0x100 < iVar12) {
                if (iVar12 == 0x101) {
                  if (uVar9 != 8) {
                    __assert_fail("num_inputs == 8",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                  ,0x18e,
                                  "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                                 );
                  }
                  if (uVar10 != 0) {
                    __assert_fail("num_outputs == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                  ,399,
                                  "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                                 );
                  }
                  if (iVar11 != 1) {
                    __assert_fail("num_controls == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                  ,400,
                                  "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                                 );
                  }
                  this_00 = ModelCircuit::add_7_segment_led(local_300);
                  goto LAB_00112d2c;
                }
                if (iVar12 == 0x301) {
                  local_2f0 = pugi::xml_node::attribute(&local_318,"nested");
                  bVar7 = pugi::xml_attribute::operator!(&local_2f0);
                  local_2f4 = (float)CONCAT31(local_2f4._1_3_,bVar7);
                  if (bVar7) {
                    this_00 = (ModelComponent *)0x0;
                  }
                  else {
                    pcVar14 = pugi::xml_attribute::as_string(&local_2f0,"");
                    this_00 = ModelCircuit::add_sub_circuit(local_300,pcVar14,uVar9,uVar10);
                    local_328._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute(&local_318,"property","key","flip")
                    ;
                    bVar7 = pugi::xml_node::operator!((xml_node *)&local_328);
                    if (!bVar7) {
                      pPVar16 = ModelComponent::property(this_00,"flip");
                      local_320 = pugi::xml_node::attribute((xml_node *)&local_328,"value");
                      bVar7 = pugi::xml_attribute::as_bool(&local_320,false);
                      (*pPVar16->_vptr_Property[10])(pPVar16,(ulong)bVar7);
                    }
                    local_320._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_318,"property","key","caption");
                    bVar7 = pugi::xml_node::operator!((xml_node *)&local_320);
                    if (!bVar7) {
                      pPVar16 = ModelComponent::property(this_00,"caption");
                      local_310 = pugi::xml_node::attribute((xml_node *)&local_320,"value");
                      pcVar14 = pugi::xml_attribute::as_string(&local_310,"");
                      (*pPVar16->_vptr_Property[8])(pPVar16,pcVar14);
                    }
                  }
                  if (local_2f4._0_1_ == '\0') goto LAB_00112d2c;
                }
                else if (iVar12 == 0x401) {
                  local_2f0._attr =
                       (xml_attribute_struct *)
                       pugi::xml_node::find_child_by_attribute(&local_318,"property","key","text");
                  bVar7 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                  if (!bVar7) {
                    local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                    bVar7 = pugi::xml_attribute::operator!(&local_328);
                    if (bVar7) goto LAB_00112bc3;
                    pcVar14 = pugi::xml_attribute::value(&local_328);
                    this_00 = ModelCircuit::add_text(local_300,pcVar14);
                    goto LAB_00112d21;
                  }
                  goto LAB_00112a71;
                }
                goto switchD_0011238e_caseD_5;
              }
              switch(iVar12) {
              case 1:
                if (uVar9 != 0) {
                  __assert_fail("num_inputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x119,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 == 0) {
                  __assert_fail("num_outputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x11a,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x11b,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_318,"property","key","name");
                bVar7 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (bVar7) {
                  bVar7 = false;
                  this_00 = (ModelComponent *)0x0;
                }
                else {
                  local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar7 = pugi::xml_attribute::operator!(&local_328);
                  if (!bVar7) {
                    local_320._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_318,"property","key","tri_state");
                    bVar7 = pugi::xml_node::operator!((xml_node *)&local_320);
                    if (!bVar7) {
                      local_310 = pugi::xml_node::attribute((xml_node *)&local_320,"value");
                      bVar7 = pugi::xml_attribute::operator!(&local_310);
                      if (bVar7) {
                        this_00 = (ModelComponent *)0x0;
                      }
                      else {
                        pcVar14 = pugi::xml_attribute::as_string(&local_328,"");
                        bVar8 = pugi::xml_attribute::as_bool(&local_310,false);
                        this_00 = ModelCircuit::add_connector_in(local_300,pcVar14,uVar10,bVar8);
                        local_2e8 = (Point)pugi::xml_node::find_child_by_attribute
                                                     (&local_318,"property","key","descending");
                        bVar8 = pugi::xml_node::operator!((xml_node *)&local_2e8);
                        if (!bVar8) {
                          pPVar16 = ModelComponent::property(this_00,"descending");
                          local_2d8 = (Point)pugi::xml_node::attribute
                                                       ((xml_node *)&local_2e8,"value");
                          bVar8 = pugi::xml_attribute::as_bool((xml_attribute *)&local_2d8,false);
                          (*pPVar16->_vptr_Property[10])(pPVar16,(ulong)bVar8);
                        }
                      }
                      bVar7 = !bVar7;
                      goto LAB_00112fd8;
                    }
                  }
                  bVar7 = false;
                  this_00 = (ModelComponent *)0x0;
                }
LAB_00112fd8:
                if (bVar7) break;
                goto switchD_0011238e_caseD_5;
              case 2:
                if (uVar9 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x127,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 0) {
                  __assert_fail("num_outputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x128,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x129,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_318,"property","key","name");
                bVar7 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar7) {
                  local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar7 = pugi::xml_attribute::operator!(&local_328);
                  if (!bVar7) {
                    local_320._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_318,"property","key","tri_state");
                    bVar7 = pugi::xml_node::operator!((xml_node *)&local_320);
                    if (!bVar7) {
                      local_310 = pugi::xml_node::attribute((xml_node *)&local_320,"value");
                      bVar7 = pugi::xml_attribute::operator!(&local_310);
                      if (bVar7) goto LAB_00112bc3;
                      pcVar14 = pugi::xml_attribute::as_string(&local_328,"");
                      bVar8 = pugi::xml_attribute::as_bool(&local_310,false);
                      this_00 = ModelCircuit::add_connector_out(local_300,pcVar14,uVar9,bVar8);
                      local_2e8 = (Point)pugi::xml_node::find_child_by_attribute
                                                   (&local_318,"property","key","descending");
                      bVar8 = pugi::xml_node::operator!((xml_node *)&local_2e8);
                      if (!bVar8) {
                        pPVar16 = ModelComponent::property(this_00,"descending");
                        local_2d8 = (Point)pugi::xml_node::attribute((xml_node *)&local_2e8,"value")
                        ;
                        bVar8 = pugi::xml_attribute::as_bool((xml_attribute *)&local_2d8,false);
                        (*pPVar16->_vptr_Property[10])(pPVar16,(ulong)bVar8);
                      }
                      goto LAB_00112d21;
                    }
                  }
                }
                goto LAB_00112a71;
              case 3:
                if (uVar9 != 0) {
                  __assert_fail("num_inputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x135,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x136,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x137,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_318,"property","key","value");
                bVar7 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (bVar7) goto LAB_00112a71;
                local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                bVar7 = pugi::xml_attribute::operator!(&local_328);
                if (bVar7) {
LAB_00112bc3:
                  this_00 = (ModelComponent *)0x0;
                }
                else {
                  this_00 = ModelCircuit::add_constant(local_300,VALUE_FALSE);
                  pPVar16 = ModelComponent::property(this_00,"value");
                  pcVar14 = pugi::xml_attribute::value(&local_328);
                  (*pPVar16->_vptr_Property[8])(pPVar16,pcVar14);
                }
LAB_00112d21:
                bVar22 = bVar7 ^ 1;
                goto LAB_00112d24;
              case 4:
                if (uVar9 != 0) {
                  __assert_fail("num_inputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x13e,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x13f,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x140,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_318,"property","key","pull_to");
                bVar7 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar7) {
                  local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar7 = pugi::xml_attribute::operator!(&local_328);
                  if (bVar7) goto LAB_00112bc3;
                  this_00 = ModelCircuit::add_pull_resistor(local_300,VALUE_FALSE);
                  pPVar16 = ModelComponent::property(this_00,"pull_to");
                  pcVar14 = pugi::xml_attribute::value(&local_328);
                  (*pPVar16->_vptr_Property[8])(pPVar16,pcVar14);
                  goto LAB_00112d21;
                }
                goto LAB_00112a71;
              default:
                goto switchD_0011238e_caseD_5;
              case 0x11:
                if (uVar9 != uVar10) {
                  __assert_fail("num_inputs == num_outputs",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x147,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x148,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_buffer(local_300,uVar9);
                break;
              case 0x12:
                if (uVar9 != uVar10) {
                  __assert_fail("num_inputs == num_outputs",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x14c,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 1) {
                  __assert_fail("num_controls == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x14d,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_tristate_buffer(local_300,uVar9);
                break;
              case 0x13:
                if (uVar9 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x151,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x152,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x153,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_and_gate(local_300,uVar9);
                break;
              case 0x14:
                if (uVar9 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x157,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x158,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x159,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_or_gate(local_300,uVar9);
                break;
              case 0x15:
                if (uVar9 != 1) {
                  __assert_fail("num_inputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x15d,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x15e,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x15f,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_not_gate(local_300);
                break;
              case 0x16:
                if (uVar9 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x163,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x164,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x165,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_nand_gate(local_300,uVar9);
                break;
              case 0x17:
                if (uVar9 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x169,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x16a,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x16b,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_nor_gate(local_300,uVar9);
                break;
              case 0x18:
                if (uVar9 != 2) {
                  __assert_fail("num_inputs == 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x16f,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x170,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x171,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_xor_gate(local_300);
                break;
              case 0x19:
                if (uVar9 != 2) {
                  __assert_fail("num_inputs == 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x175,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x176,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x177,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_xnor_gate(local_300);
                break;
              case 0x20:
                if (uVar9 == 0) {
                  __assert_fail("num_inputs >= 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x17b,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 0) {
                  __assert_fail("num_outputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x17c,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x17d,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_318,"property","key","name");
                bVar7 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar7) {
                  local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar7 = pugi::xml_attribute::operator!(&local_328);
                  if (!bVar7) {
                    local_320._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_318,"property","key","right");
                    bVar7 = pugi::xml_node::operator!((xml_node *)&local_320);
                    if (!bVar7) {
                      local_310 = pugi::xml_node::attribute((xml_node *)&local_320,"value");
                      bVar7 = pugi::xml_attribute::operator!(&local_310);
                      if (bVar7) goto LAB_00112bc3;
                      pcVar14 = pugi::xml_attribute::as_string(&local_328,"");
                      this_00 = ModelCircuit::add_via(local_300,pcVar14,uVar9);
                      pPVar16 = ModelComponent::property(this_00,"right");
                      bVar8 = pugi::xml_attribute::as_bool(&local_310,false);
                      (*pPVar16->_vptr_Property[10])(pPVar16,(ulong)bVar8);
                      goto LAB_00112d21;
                    }
                  }
                }
                goto LAB_00112a71;
              case 0x21:
                if (uVar9 != 0) {
                  __assert_fail("num_inputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x185,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar10 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x186,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar11 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x187,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute
                               (&local_318,"property","key","low_duration");
                bVar7 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar7) {
                  local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar7 = pugi::xml_attribute::operator!(&local_328);
                  if (!bVar7) {
                    local_320._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_318,"property","key","high_duration");
                    bVar7 = pugi::xml_node::operator!((xml_node *)&local_320);
                    if (!bVar7) {
                      local_310 = pugi::xml_node::attribute((xml_node *)&local_320,"value");
                      bVar7 = pugi::xml_attribute::operator!(&local_310);
                      if (bVar7) goto LAB_00112bc3;
                      uVar9 = pugi::xml_attribute::as_int(&local_328,0);
                      uVar10 = pugi::xml_attribute::as_int(&local_310,0);
                      this_00 = ModelCircuit::add_oscillator(local_300,uVar9,uVar10);
                      goto LAB_00112d21;
                    }
                  }
                }
LAB_00112a71:
                bVar22 = 0;
                this_00 = (ModelComponent *)0x0;
LAB_00112d24:
                if (bVar22 != 0) break;
                goto switchD_0011238e_caseD_5;
              }
LAB_00112d2c:
              local_2f0._attr =
                   (xml_attribute_struct *)
                   pugi::xml_node::find_child_by_attribute
                             (&local_318,"property","key","initial_output");
              bVar7 = pugi::xml_node::operator!((xml_node *)&local_2f0);
              if (!bVar7) {
                pPVar16 = ModelComponent::property(this_00,"initial_output");
                local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                pcVar14 = pugi::xml_attribute::value(&local_328);
                (*pPVar16->_vptr_Property[8])(pPVar16,pcVar14);
              }
              local_328._attr = (xml_attribute_struct *)pugi::xml_node::child(&local_318,"position")
              ;
              bVar7 = pugi::xml_node::operator!((xml_node *)&local_328);
              if (bVar7) {
LAB_00112dc0:
                local_320._attr =
                     (xml_attribute_struct *)pugi::xml_node::child(&local_318,"orientation");
                bVar7 = pugi::xml_node::operator!((xml_node *)&local_320);
                if (!bVar7) {
                  local_310 = pugi::xml_node::attribute((xml_node *)&local_320,"angle");
                  bVar7 = pugi::xml_attribute::operator!(&local_310);
                  if (bVar7) goto switchD_0011238e_caseD_5;
                  iVar12 = pugi::xml_attribute::as_int(&local_310,0);
                  ModelComponent::set_angle(this_00,iVar12);
                }
                if (this_00 != (ModelComponent *)0x0) {
                  mVar2 = this_00->m_id;
                  iVar12 = pugi::xml_attribute::as_int((xml_attribute *)&local_1d8,0);
                  local_310._attr._0_4_ = iVar12;
                  pmVar17 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_68,(key_type *)&local_310);
                  *pmVar17 = mVar2;
                }
              }
              else {
                local_320 = pugi::xml_node::attribute((xml_node *)&local_328,"x");
                bVar7 = pugi::xml_attribute::operator!(&local_320);
                if (!bVar7) {
                  local_310 = pugi::xml_node::attribute((xml_node *)&local_328,"y");
                  bVar7 = pugi::xml_attribute::operator!(&local_310);
                  if (!bVar7) {
                    fVar25 = pugi::xml_attribute::as_float(&local_320,0.0);
                    y = pugi::xml_attribute::as_float(&local_310,0.0);
                    Point::Point(&local_2e8,fVar25,y);
                    ModelComponent::set_position(this_00,&local_2e8);
                    goto LAB_00112dc0;
                  }
                }
              }
switchD_0011238e_caseD_5:
              pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)local_288);
              bVar7 = pugi::xml_named_node_iterator::operator!=
                                ((xml_named_node_iterator *)local_288,&local_218);
            }
            pugi::xml_node::children
                      ((xml_object_range<pugi::xml_named_node_iterator> *)local_268,&local_2c8,
                       "wire");
            local_228 = (xml_node_struct *)local_258._0_8_;
            local_258._32_8_ = local_268._0_8_;
            pxStack_230 = (xml_node_struct *)local_268._8_8_;
            local_1f8._name = (char_t *)local_258._24_8_;
            local_1f8._wrap._root = (xml_node_struct *)local_258._8_8_;
            local_1f8._parent._root = (xml_node_struct *)local_258._16_8_;
            bVar7 = pugi::xml_named_node_iterator::operator!=
                              ((xml_named_node_iterator *)(local_258 + 0x20),&local_1f8);
            while (bVar7 != false) {
              pxVar13 = pugi::xml_named_node_iterator::operator*
                                  ((xml_named_node_iterator *)(local_258 + 0x20));
              local_2d0._attr = (xml_attribute_struct *)pxVar13->_root;
              this_01 = ModelCircuit::create_wire(local_300);
              pugi::xml_node::children(&local_2b8,(xml_node *)&local_2d0,"segment");
              local_288._16_8_ = local_2b8._begin._name;
              local_288._0_8_ = local_2b8._begin._wrap._root;
              local_288._8_8_ = local_2b8._begin._parent._root;
              local_218._name = local_2b8._end._name;
              local_218._wrap._root = local_2b8._end._wrap._root;
              local_218._parent._root = local_2b8._end._parent._root;
              bVar7 = pugi::xml_named_node_iterator::operator!=
                                ((xml_named_node_iterator *)local_288,&local_218);
              while (bVar7 != false) {
                pxVar13 = pugi::xml_named_node_iterator::operator*
                                    ((xml_named_node_iterator *)local_288);
                local_1d8._wrap._root = pxVar13->_root;
                local_2f0 = pugi::xml_node::attribute(&local_1d8._wrap,"x1");
                bVar8 = pugi::xml_attribute::operator!(&local_2f0);
                if (bVar8) {
LAB_00113227:
                  if (bVar7 != false) goto LAB_0011322d;
                  break;
                }
                local_328 = pugi::xml_node::attribute(&local_1d8._wrap,"y1");
                bVar8 = pugi::xml_attribute::operator!(&local_328);
                if (bVar8) goto LAB_00113227;
                local_320 = pugi::xml_node::attribute(&local_1d8._wrap,"x2");
                bVar8 = pugi::xml_attribute::operator!(&local_320);
                if (bVar8) goto LAB_00113227;
                local_310 = pugi::xml_node::attribute(&local_1d8._wrap,"y2");
                bVar8 = pugi::xml_attribute::operator!(&local_310);
                if (bVar8) goto LAB_00113227;
                local_2f4 = pugi::xml_attribute::as_float(&local_2f0,0.0);
                fVar25 = pugi::xml_attribute::as_float(&local_328,0.0);
                Point::Point(&local_2e8,local_2f4,fVar25);
                local_2f4 = pugi::xml_attribute::as_float(&local_320,0.0);
                fVar25 = pugi::xml_attribute::as_float(&local_310,0.0);
                Point::Point(&local_2d8,local_2f4,fVar25);
                ModelWire::add_segment(this_01,&local_2e8,&local_2d8);
                pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)local_288);
                bVar7 = pugi::xml_named_node_iterator::operator!=
                                  ((xml_named_node_iterator *)local_288,&local_218);
              }
              pugi::xml_node::children(&local_2b8,(xml_node *)&local_2d0,"pin");
              local_218._name = local_2b8._begin._name;
              local_218._wrap._root = local_2b8._begin._wrap._root;
              local_218._parent._root = local_2b8._begin._parent._root;
              local_1d8._name = local_2b8._end._name;
              local_1d8._wrap._root = local_2b8._end._wrap._root;
              local_1d8._parent._root = local_2b8._end._parent._root;
              bVar7 = pugi::xml_named_node_iterator::operator!=(&local_218,&local_1d8);
              while (bVar7 != false) {
                pxVar13 = pugi::xml_named_node_iterator::operator*(&local_218);
                local_2f0._attr = (xml_attribute_struct *)pxVar13->_root;
                local_328 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                bVar7 = pugi::xml_attribute::operator!(&local_328);
                if (bVar7) break;
                pcVar14 = pugi::xml_attribute::as_string(&local_328,"");
                std::__cxx11::string::string((string *)local_288,pcVar14,(allocator *)&local_320);
                lVar18 = std::__cxx11::string::find((char)(xml_named_node_iterator *)local_288,0x23)
                ;
                if (lVar18 == -1) {
                  error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                            ,"Unparseable location \"%s\"; should contain a comma");
                }
                else {
                  uVar19 = strtol((char *)local_288._0_8_,(char **)0x0,0);
                  uVar21 = (uVar19 & 0xffffffff) % local_68._M_bucket_count;
                  p_Var4 = local_68._M_buckets[uVar21];
                  p_Var20 = (__node_base_ptr)0x0;
                  if ((p_Var4 != (__node_base_ptr)0x0) &&
                     (p_Var20 = p_Var4, p_Var23 = p_Var4->_M_nxt,
                     *(uint *)&p_Var4->_M_nxt[1]._M_nxt != (uint)uVar19)) {
                    while (p_Var24 = p_Var23->_M_nxt, p_Var24 != (_Hash_node_base *)0x0) {
                      p_Var20 = (__node_base_ptr)0x0;
                      if (((ulong)*(uint *)&p_Var24[1]._M_nxt % local_68._M_bucket_count != uVar21)
                         || (p_Var20 = p_Var23, p_Var23 = p_Var24,
                            *(uint *)&p_Var24[1]._M_nxt == (uint)uVar19)) goto LAB_001133b8;
                    }
                    p_Var20 = (__node_base_ptr)0x0;
                  }
LAB_001133b8:
                  if (p_Var20 == (__node_base_ptr)0x0) {
                    p_Var24 = (_Hash_node_base *)0x0;
                  }
                  else {
                    p_Var24 = p_Var20->_M_nxt;
                  }
                  if (p_Var24 == (_Hash_node_base *)0x0) {
                    error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,"Unknown component-id \"%d\" in wire",uVar19);
                  }
                  uVar3 = *(uint *)((long)&p_Var24[1]._M_nxt + 4);
                  uVar19 = strtol((char *)((long)(uintptr_t *)local_288._0_8_ + lVar18 + 1),
                                  (char **)0x0,0);
                  ModelWire::add_pin(this_01,uVar19 & 0xffffffff | (ulong)uVar3 << 0x20);
                }
                if ((xml_node_struct *)local_288._0_8_ != (xml_node_struct *)(local_288 + 0x10)) {
                  operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
                }
                if (lVar18 == -1) break;
                pugi::xml_named_node_iterator::operator++(&local_218);
                bVar7 = pugi::xml_named_node_iterator::operator!=(&local_218,&local_1d8);
              }
LAB_0011322d:
              pugi::xml_named_node_iterator::operator++
                        ((xml_named_node_iterator *)(local_258 + 0x20));
              bVar7 = pugi::xml_named_node_iterator::operator!=
                                ((xml_named_node_iterator *)(local_258 + 0x20),&local_1f8);
            }
          }
          pugi::xml_named_node_iterator::operator++(&local_1b8);
          bVar7 = pugi::xml_named_node_iterator::operator!=(&local_1b8,&local_168);
        } while (bVar7);
      }
      local_2b8._begin._wrap = pugi::xml_node::child(&local_2c0,"main");
      bVar7 = pugi::xml_node::operator!((xml_node *)&local_2b8);
      if (!bVar7) {
        local_268._0_8_ = pugi::xml_node::attribute((xml_node *)&local_2b8,"name");
        bVar7 = pugi::xml_attribute::operator!((xml_attribute *)local_268);
        if (bVar7) goto LAB_0011356f;
        pcVar14 = pugi::xml_attribute::as_string((xml_attribute *)local_268,"");
        psVar1 = &local_2e0->m_main_circuit;
        pcVar5 = (char *)(local_2e0->m_main_circuit)._M_string_length;
        strlen(pcVar14);
        std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,(ulong)pcVar14);
      }
      if ((local_2e0->m_circuits).
          super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (local_2e0->m_circuits).
          super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        idx = 0;
        do {
          this_02 = ModelCircuitLibrary::circuit_by_idx(local_2e0,idx);
          ModelCircuit::sync_sub_circuit_components(this_02);
          idx = idx + 1;
        } while (idx < (ulong)((long)(local_2e0->m_circuits).
                                     super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_2e0->m_circuits).
                                     super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
  }
LAB_0011356f:
  uVar6 = local_301;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  pugi::xml_document::~xml_document(&local_148);
  return (bool)uVar6;
}

Assistant:

bool deserialize_library(LSimContext *context, ModelCircuitLibrary *lib, const char *filename) {
    assert(context);
    assert(lib);
    assert(filename);

    Deserializer deserializer(context);
    
    if (!deserializer.load_from_file(filename)) {
        return false;
    }

    deserializer.parse_library(lib);

    return true;
}